

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void lj_snap_add(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  SnapEntry *pSVar4;
  IRIns *pIVar5;
  TValue *pTVar6;
  uint uVar7;
  uint uVar8;
  TValue *pTVar9;
  int iVar10;
  TValue *pTVar11;
  uint uVar12;
  ulong uVar13;
  SnapEntry SVar14;
  ulong uVar15;
  SnapShot *pSVar16;
  uint32_t uVar17;
  uint uVar18;
  
  uVar1 = (J->cur).nsnap;
  uVar13 = (ulong)uVar1;
  uVar17 = (J->cur).nsnapmap;
  uVar7 = (uint)uVar1;
  if (((uVar1 != 0) && ((J->cur).nins == (uint)(J->cur).snap[uVar13 - 1].ref)) ||
     ((J->mergesnap != '\0' && (-1 < (char)(J->guardemit).irt)))) {
    if (uVar7 != 1) {
      pSVar16 = (J->cur).snap;
      uVar13 = (ulong)(uVar7 - 1);
      uVar17 = pSVar16[uVar13].mapofs;
      goto LAB_0014541f;
    }
    (J->fold).ins.field_0.ot = 0xc00;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
  }
  if (J->sizesnap <= uVar7) {
    lj_snap_grow_buf_(J,uVar1 + 1);
  }
  (J->cur).nsnap = (uint16_t)(uVar1 + 1);
  pSVar16 = (J->cur).snap;
LAB_0014541f:
  uVar7 = 0;
  J->mergesnap = '\0';
  (J->guardemit).irt = '\0';
  uVar18 = J->maxslot + J->baseslot;
  uVar8 = J->framedepth + uVar17 + uVar18 + 1;
  if (J->sizesnapmap < uVar8) {
    lj_snap_grow_map_(J,uVar8);
  }
  pSVar16 = pSVar16 + uVar13;
  pSVar4 = (J->cur).snapmap;
  if (uVar18 != 0) {
    uVar1 = J->chain[0xb];
    iVar10 = 0;
    uVar13 = 0;
    uVar7 = 0;
    do {
      uVar8 = J->slot[uVar13];
      uVar15 = (ulong)(uVar8 & 0xffff);
      if (uVar15 != 0) {
        SVar14 = iVar10 + (uVar8 & 0x3ffff);
        if (((((uVar8 & 0x30000) == 0) &&
             (pIVar5 = (J->cur).ir, *(char *)((long)pIVar5 + uVar15 * 8 + 5) == 'F')) &&
            (uVar13 == pIVar5[uVar15].field_0.op1)) && ((uint)uVar1 < (uVar8 & 0xffff))) {
          uVar2 = *(ushort *)((long)pIVar5 + uVar15 * 8 + 2);
          if ((uVar2 & 0x20) == 0) goto LAB_001454f1;
          if ((uVar2 & 0x11) != 1) {
            SVar14 = iVar10 + 0x40000 + (uVar8 & 0x3ffff);
          }
        }
        uVar15 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        pSVar4[uVar17 + uVar15] = SVar14;
      }
LAB_001454f1:
      uVar13 = uVar13 + 1;
      iVar10 = iVar10 + 0x1000000;
    } while (uVar18 != uVar13);
  }
  pSVar16->nent = (uint8_t)uVar7;
  pSVar4 = pSVar4 + (ulong)uVar17 + (ulong)uVar7;
  pTVar6 = J->L->base;
  pTVar11 = pTVar6 + -1;
  uVar8 = J->baseslot;
  if (*(char *)((ulong)pTVar6[-1].u32.lo + 6) == '\0') {
    pTVar9 = pTVar11 + *(byte *)((ulong)*(uint *)((ulong)pTVar6[-1].u32.lo + 0x10) - 0x39);
  }
  else {
    pTVar9 = J->L->top;
  }
  pTVar6 = pTVar6 + -(ulong)uVar8;
  *pSVar4 = *(SnapEntry *)&J->pc;
  uVar12 = 1;
  if (1 < uVar8) {
    uVar8 = 1;
    do {
      while( true ) {
        uVar3 = (pTVar11->field_2).it;
        if ((uVar3 & 3) != 0) break;
        pSVar4[uVar8] = uVar3;
        pTVar11 = pTVar11 + (-1 - (ulong)*(byte *)((ulong)(pTVar11->field_2).it - 3));
        uVar8 = uVar8 + 1;
LAB_001455ce:
        if (pTVar9 < pTVar11 + *(byte *)((ulong)*(uint *)((ulong)(pTVar11->u32).lo + 0x10) - 0x39))
        {
          pTVar9 = pTVar11 + *(byte *)((ulong)*(uint *)((ulong)(pTVar11->u32).lo + 0x10) - 0x39);
        }
        uVar12 = uVar8;
        if (pTVar11 <= pTVar6) goto LAB_001455f3;
      }
      uVar12 = uVar8 + 1;
      pSVar4[uVar8] = uVar3;
      if ((uVar3 & 7) == 2) {
        pSVar4[uVar12] = *(SnapEntry *)((long)pTVar11 + -4);
        pTVar11 = (TValue *)
                  ((long)pTVar11 - ((long)(int)(pTVar11->field_2).it & 0xfffffffffffffff8U));
        uVar8 = uVar8 + 2;
        goto LAB_001455ce;
      }
      pTVar11 = (TValue *)((long)pTVar11 - ((long)(int)(pTVar11->field_2).it & 0xfffffffffffffff8U))
      ;
      uVar8 = uVar12;
    } while (pTVar6 < pTVar11);
  }
LAB_001455f3:
  pSVar16->topslot = (uint8_t)((uint)((int)pTVar9 - (int)pTVar6) >> 3);
  pSVar16->mapofs = uVar17;
  pSVar16->ref = (IRRef1)(J->cur).nins;
  pSVar16->mcofs = 0;
  pSVar16->nslots = (uint8_t)uVar18;
  pSVar16->count = '\0';
  (J->cur).nsnapmap = uVar7 + uVar17 + uVar12;
  return;
}

Assistant:

void lj_snap_add(jit_State *J)
{
  MSize nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  /* Merge if no ins. inbetween or if requested and no guard inbetween. */
  if ((nsnap > 0 && J->cur.snap[nsnap-1].ref == J->cur.nins) ||
      (J->mergesnap && !irt_isguard(J->guardemit))) {
    if (nsnap == 1) {  /* But preserve snap #0 PC. */
      emitir_raw(IRT(IR_NOP, IRT_NIL), 0, 0);
      goto nomerge;
    }
    nsnapmap = J->cur.snap[--nsnap].mapofs;
  } else {
  nomerge:
    lj_snap_grow_buf(J, nsnap+1);
    J->cur.nsnap = (uint16_t)(nsnap+1);
  }
  J->mergesnap = 0;
  J->guardemit.irt = 0;
  snapshot_stack(J, &J->cur.snap[nsnap], nsnapmap);
}